

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_6875f4::Target::DumpArtifacts(Value *__return_storage_ptr__,Target *this)

{
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *pvVar1;
  bool bVar2;
  TargetType TVar3;
  uint uVar4;
  cmGlobalGenerator *pcVar5;
  reference ppcVar6;
  Value *pVVar7;
  ulong uVar8;
  string local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  string local_2b8;
  Value local_298;
  undefined1 local_270 [8];
  Value artifact_3;
  OutputInfo *output;
  string local_220;
  Value local_200;
  undefined1 local_1d8 [8];
  Value artifact_2;
  string local_190;
  Value local_170;
  undefined1 local_148 [8];
  Value artifact_1;
  string local_100;
  Value local_e0;
  undefined1 local_b8 [8];
  Value artifact;
  string *obj;
  cmSourceFile *sf;
  iterator __end2;
  iterator __begin2;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__range2;
  string obj_dir;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectSources;
  Target *this_local;
  Value *artifacts;
  
  Json::Value::Value(__return_storage_ptr__,arrayValue);
  TVar3 = cmGeneratorTarget::GetType(this->GT);
  if (TVar3 == OBJECT_LIBRARY) {
    pcVar5 = cmGeneratorTarget::GetGlobalGenerator(this->GT);
    uVar4 = (*pcVar5->_vptr_cmGlobalGenerator[0x25])(pcVar5,0);
    if ((uVar4 & 1) != 0) {
      pvVar1 = (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
               ((long)&obj_dir.field_2 + 8);
      std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector(pvVar1);
      cmGeneratorTarget::GetObjectSources(this->GT,pvVar1,this->Config);
      cmGeneratorTarget::GetObjectDirectory((string *)&__range2,this->GT,this->Config);
      pvVar1 = (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
               ((long)&obj_dir.field_2 + 8);
      __end2 = std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin
                         (pvVar1);
      sf = (cmSourceFile *)
           std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end(pvVar1);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                                         *)&sf), bVar2) {
        ppcVar6 = __gnu_cxx::
                  __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                  ::operator*(&__end2);
        artifact.limit_ = (ptrdiff_t)cmGeneratorTarget::GetObjectName_abi_cxx11_(this->GT,*ppcVar6);
        Json::Value::Value((Value *)local_b8,objectValue);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &artifact_1.limit_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &__range2,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       artifact.limit_);
        RelativeIfUnder(&local_100,&this->TopBuild,(string *)&artifact_1.limit_);
        Json::Value::Value(&local_e0,&local_100);
        pVVar7 = Json::Value::operator[]((Value *)local_b8,"path");
        Json::Value::operator=(pVVar7,&local_e0);
        Json::Value::~Value(&local_e0);
        std::__cxx11::string::~string((string *)&local_100);
        std::__cxx11::string::~string((string *)&artifact_1.limit_);
        Json::Value::append(__return_storage_ptr__,(Value *)local_b8);
        Json::Value::~Value((Value *)local_b8);
        __gnu_cxx::
        __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
        ::operator++(&__end2);
      }
      std::__cxx11::string::~string((string *)&__range2);
      std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~vector
                ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                 ((long)&obj_dir.field_2 + 8));
    }
  }
  else {
    Json::Value::Value((Value *)local_148,objectValue);
    cmGeneratorTarget::GetFullPath
              ((string *)&artifact_2.limit_,this->GT,this->Config,RuntimeBinaryArtifact,false);
    RelativeIfUnder(&local_190,&this->TopBuild,(string *)&artifact_2.limit_);
    Json::Value::Value(&local_170,&local_190);
    pVVar7 = Json::Value::operator[]((Value *)local_148,"path");
    Json::Value::operator=(pVVar7,&local_170);
    Json::Value::~Value(&local_170);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&artifact_2.limit_);
    Json::Value::append(__return_storage_ptr__,(Value *)local_148);
    Json::Value::~Value((Value *)local_148);
    bVar2 = cmGeneratorTarget::IsDLLPlatform(this->GT);
    if ((bVar2) && (TVar3 = cmGeneratorTarget::GetType(this->GT), TVar3 != STATIC_LIBRARY)) {
      TVar3 = cmGeneratorTarget::GetType(this->GT);
      if ((TVar3 == SHARED_LIBRARY) ||
         (bVar2 = cmGeneratorTarget::IsExecutableWithExports(this->GT), bVar2)) {
        Json::Value::Value((Value *)local_1d8,objectValue);
        cmGeneratorTarget::GetFullPath
                  ((string *)&output,this->GT,this->Config,ImportLibraryArtifact,false);
        RelativeIfUnder(&local_220,&this->TopBuild,(string *)&output);
        Json::Value::Value(&local_200,&local_220);
        pVVar7 = Json::Value::operator[]((Value *)local_1d8,"path");
        Json::Value::operator=(pVVar7,&local_200);
        Json::Value::~Value(&local_200);
        std::__cxx11::string::~string((string *)&local_220);
        std::__cxx11::string::~string((string *)&output);
        Json::Value::append(__return_storage_ptr__,(Value *)local_1d8);
        Json::Value::~Value((Value *)local_1d8);
      }
      artifact_3.limit_ = (ptrdiff_t)cmGeneratorTarget::GetOutputInfo(this->GT,this->Config);
      if (((OutputInfo *)artifact_3.limit_ != (OutputInfo *)0x0) &&
         (uVar8 = std::__cxx11::string::empty(), (uVar8 & 1) == 0)) {
        Json::Value::Value((Value *)local_270,objectValue);
        std::operator+(&local_2f8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (artifact_3.limit_ + 0x40),'/');
        cmGeneratorTarget::GetPDBName(&local_318,this->GT,this->Config);
        std::operator+(&local_2d8,&local_2f8,&local_318);
        RelativeIfUnder(&local_2b8,&this->TopBuild,&local_2d8);
        Json::Value::Value(&local_298,&local_2b8);
        pVVar7 = Json::Value::operator[]((Value *)local_270,"path");
        Json::Value::operator=(pVVar7,&local_298);
        Json::Value::~Value(&local_298);
        std::__cxx11::string::~string((string *)&local_2b8);
        std::__cxx11::string::~string((string *)&local_2d8);
        std::__cxx11::string::~string((string *)&local_318);
        std::__cxx11::string::~string((string *)&local_2f8);
        Json::Value::append(__return_storage_ptr__,(Value *)local_270);
        Json::Value::~Value((Value *)local_270);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value Target::DumpArtifacts()
{
  Json::Value artifacts = Json::arrayValue;

  // Object libraries have only object files as artifacts.
  if (this->GT->GetType() == cmStateEnums::OBJECT_LIBRARY) {
    if (!this->GT->GetGlobalGenerator()->HasKnownObjectFileLocation(nullptr)) {
      return artifacts;
    }
    std::vector<cmSourceFile const*> objectSources;
    this->GT->GetObjectSources(objectSources, this->Config);
    std::string const obj_dir = this->GT->GetObjectDirectory(this->Config);
    for (cmSourceFile const* sf : objectSources) {
      const std::string& obj = this->GT->GetObjectName(sf);
      Json::Value artifact = Json::objectValue;
      artifact["path"] = RelativeIfUnder(this->TopBuild, obj_dir + obj);
      artifacts.append(std::move(artifact)); // NOLINT(*)
    }
    return artifacts;
  }

  // Other target types always have a "main" artifact.
  {
    Json::Value artifact = Json::objectValue;
    artifact["path"] =
      RelativeIfUnder(this->TopBuild,
                      this->GT->GetFullPath(
                        this->Config, cmStateEnums::RuntimeBinaryArtifact));
    artifacts.append(std::move(artifact)); // NOLINT(*)
  }

  // Add Windows-specific artifacts produced by the linker.
  if (this->GT->IsDLLPlatform() &&
      this->GT->GetType() != cmStateEnums::STATIC_LIBRARY) {
    if (this->GT->GetType() == cmStateEnums::SHARED_LIBRARY ||
        this->GT->IsExecutableWithExports()) {
      Json::Value artifact = Json::objectValue;
      artifact["path"] =
        RelativeIfUnder(this->TopBuild,
                        this->GT->GetFullPath(
                          this->Config, cmStateEnums::ImportLibraryArtifact));
      artifacts.append(std::move(artifact)); // NOLINT(*)
    }
    cmGeneratorTarget::OutputInfo const* output =
      this->GT->GetOutputInfo(this->Config);
    if (output && !output->PdbDir.empty()) {
      Json::Value artifact = Json::objectValue;
      artifact["path"] = RelativeIfUnder(this->TopBuild,
                                         output->PdbDir + '/' +
                                           this->GT->GetPDBName(this->Config));
      artifacts.append(std::move(artifact)); // NOLINT(*)
    }
  }
  return artifacts;
}